

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O3

void __thiscall
Js::BufferBuilderOf<int,_true>::Write
          (BufferBuilderOf<int,_true> *this,byte *buffer,uint32 bufferSize)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  uint32 size;
  
  uVar2 = *(uint *)&(this->super_BufferBuilder).field_0x14;
  if (uVar2 < 0xfe) {
    uVar3 = (this->super_BufferBuilder).offset;
    if (uVar3 == bufferSize) goto LAB_00870d16;
    buffer[uVar3] = (byte)uVar2;
    size = 1;
  }
  else {
    uVar3 = (this->super_BufferBuilder).offset;
    if (uVar2 - 0xfe < 0xff02) {
      if (bufferSize - uVar3 < 3) {
LAB_00870d16:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      buffer[uVar3] = 0xfe;
      uVar4 = (this->super_BufferBuilder).field_0x15;
      uVar2 = (this->super_BufferBuilder).offset;
      (buffer + (ulong)uVar2 + 1)[0] = (this->super_BufferBuilder).field_0x14;
      (buffer + (ulong)uVar2 + 1)[1] = uVar4;
      size = 3;
    }
    else {
      if (bufferSize - uVar3 < 5) goto LAB_00870d16;
      buffer[uVar3] = 0xff;
      uVar4 = (this->super_BufferBuilder).field_0x15;
      uVar5 = (this->super_BufferBuilder).field_0x16;
      uVar6 = (this->super_BufferBuilder).field_0x17;
      pbVar1 = buffer + (ulong)(this->super_BufferBuilder).offset + 1;
      pbVar1[0] = (this->super_BufferBuilder).field_0x14;
      pbVar1[1] = uVar4;
      pbVar1[2] = uVar5;
      pbVar1[3] = uVar6;
      size = 5;
    }
  }
  BufferBuilder::TraceOutput(&this->super_BufferBuilder,buffer,size);
  return;
}

Assistant:

void Write(__in_bcount(bufferSize) byte * buffer, __in uint32 bufferSize) const
        {
            DebugOnly(uint32 size = sizeof(T));

#if INSTRUMENT_BUFFER_INTS
            if (value < ((1 << 8)))
            {
                Counts[0]++;
            }
            else if (value < ((1 << 16)))
            {
                Counts[1]++;
            }
            else if (value < ((1 << 24)))
            {
                Counts[2]++;
            }
            else
            {
                Counts[3]++;
            }
#endif

            if (useVariableIntEncoding)
            {
                if (UseOneByte())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(byte));
                    *(serialization_alignment byte*)(buffer + this->offset) = (byte) value;
                }
                else if (UseTwoBytes())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment uint16) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(uint16) + 1);
                    *(serialization_alignment byte*)(buffer + this->offset) = TWO_BYTE_SENTINEL;
                    *(serialization_alignment uint16*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = (uint16) this->value;
                }
                else
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment T) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    *(serialization_alignment byte*)(buffer + this->offset) = FOUR_BYTE_SENTINEL;
                    *(serialization_alignment T*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = this->value;
                    DebugOnly(size = sizeof(T) + 1);
#if INSTRUMENT_BUFFER_INTS
                    Output::Print(_u("[BCGENSTATS] %d, %d\n"), value, sizeof(T));
#endif
                }
            }
            else
            {
                if (bufferSize - this->offset<sizeof(serialization_alignment T))
                {
                    Throw::FatalInternalError();
                }
                *(serialization_alignment T*)(buffer + this->offset) = value;
            }
            DebugOnly(TraceOutput(buffer, size));
        }